

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_str_insert_text_utf8(nk_str *str,int pos,char *text,int len)

{
  int iVar1;
  int iVar2;
  int len_00;
  nk_rune unicode;
  nk_rune local_34;
  
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x210d,"int nk_str_insert_text_utf8(struct nk_str *, int, const char *, int)");
  }
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x210e,"int nk_str_insert_text_utf8(struct nk_str *, int, const char *, int)");
  }
  if (len != 0) {
    if (len < 1) {
      len_00 = 0;
    }
    else {
      len_00 = 0;
      iVar2 = len;
      do {
        iVar1 = nk_utf_decode(text + len_00,&local_34,4);
        len_00 = len_00 + iVar1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    nk_str_insert_at_rune(str,pos,text,len_00);
  }
  return len;
}

Assistant:

NK_API int
nk_str_insert_text_utf8(struct nk_str *str, int pos, const char *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_rune unicode;

    NK_ASSERT(str);
    NK_ASSERT(text);
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i)
        byte_len += nk_utf_decode(text+byte_len, &unicode, 4);
    nk_str_insert_at_rune(str, pos, text, byte_len);
    return len;
}